

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altref_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2863ff::GoldenFrameIntervalTestLarge::~GoldenFrameIntervalTestLarge
          (GoldenFrameIntervalTestLarge *this)

{
  code *pcVar1;
  GoldenFrameIntervalTestLarge *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

~GoldenFrameIntervalTestLarge() override = default;